

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O0

void duckdb_brotli::BrotliConvertBitDepthsToSymbols(uint8_t *depth,size_t len,uint16_t *bits)

{
  byte bVar1;
  uint16_t uVar2;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  int code;
  size_t i;
  uint16_t next_code [16];
  uint16_t bl_count [16];
  ulong local_60;
  uint16_t local_58 [16];
  short local_38 [16];
  long local_18;
  ulong local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_38,0,0x20);
  uVar2 = 0;
  for (local_60 = 0; local_60 < local_10; local_60 = local_60 + 1) {
    local_38[*(byte *)(local_8 + local_60)] = local_38[*(byte *)(local_8 + local_60)] + 1;
  }
  local_38[0] = 0;
  local_58[0] = 0;
  for (local_60 = 1; local_60 < 0x10; local_60 = local_60 + 1) {
    uVar2 = (uVar2 + local_38[local_60 - 1]) * 2;
    local_58[local_60] = uVar2;
  }
  for (local_60 = 0; local_60 < local_10; local_60 = local_60 + 1) {
    if (*(char *)(local_8 + local_60) != '\0') {
      bVar1 = *(byte *)(local_8 + local_60);
      uVar2 = local_58[*(byte *)(local_8 + local_60)];
      local_58[*(byte *)(local_8 + local_60)] = uVar2 + 1;
      uVar2 = BrotliReverseBits((ulong)bVar1,uVar2);
      *(uint16_t *)(local_18 + local_60 * 2) = uVar2;
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliConvertBitDepthsToSymbols(const uint8_t* depth,
                                     size_t len,
                                     uint16_t* bits) {
  /* In Brotli, all bit depths are [1..15]
     0 bit depth means that the symbol does not exist. */
  uint16_t bl_count[MAX_HUFFMAN_BITS] = { 0 };
  uint16_t next_code[MAX_HUFFMAN_BITS];
  size_t i;
  int code = 0;
  for (i = 0; i < len; ++i) {
    ++bl_count[depth[i]];
  }
  bl_count[0] = 0;
  next_code[0] = 0;
  for (i = 1; i < MAX_HUFFMAN_BITS; ++i) {
    code = (code + bl_count[i - 1]) << 1;
    next_code[i] = (uint16_t)code;
  }
  for (i = 0; i < len; ++i) {
    if (depth[i]) {
      bits[i] = BrotliReverseBits(depth[i], next_code[depth[i]]++);
    }
  }
}